

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O1

double xc_bessel_K0_scaled(double x)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (x <= 0.0) {
    xc_bessel_K0_scaled_cold_1();
    dVar3 = 0.0;
  }
  else if (x <= 2.0) {
    dVar3 = exp(x);
    dVar2 = log(x * 0.5);
    dVar5 = xc_bessel_I0(x);
    dVar8 = x * 0.5 * x + -1.0;
    uVar1 = 0xc;
    dVar4 = 0.0;
    dVar7 = 0.0;
    do {
      dVar6 = dVar7;
      dVar7 = dVar4;
      dVar4 = ((dVar8 + dVar8) * dVar7 - dVar6) + ai12_data[uVar1 + 0x14];
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
    dVar3 = dVar3 * ((dVar4 - dVar6) * 0.5 + (-0.25 - dVar2 * dVar5));
  }
  else {
    if (x <= 8.0) {
      dVar7 = (16.0 / x + -5.0) / 3.0;
      uVar1 = 0x12;
      dVar3 = 0.0;
      dVar4 = 0.0;
      do {
        dVar2 = dVar3;
        dVar5 = ((dVar7 + dVar7) * dVar4 - dVar2) + bk0_data[uVar1 + 10];
        uVar1 = uVar1 - 1;
        dVar3 = dVar4;
        dVar4 = dVar5;
      } while (1 < uVar1);
    }
    else {
      dVar7 = 16.0 / x + -1.0;
      uVar1 = 0xf;
      dVar3 = 0.0;
      dVar4 = 0.0;
      do {
        dVar2 = dVar3;
        dVar5 = ((dVar7 + dVar7) * dVar4 - dVar2) + ak0_data[uVar1 + 0x10];
        uVar1 = uVar1 - 1;
        dVar3 = dVar4;
        dVar4 = dVar5;
      } while (1 < uVar1);
    }
    if (x < 0.0) {
      dVar3 = sqrt(x);
    }
    else {
      dVar3 = SQRT(x);
    }
    dVar3 = ((dVar5 - dVar2) * 0.5 + 1.25) / dVar3;
  }
  return dVar3;
}

Assistant:

GPU_FUNCTION
double xc_bessel_K0_scaled(const double x)
{
  double r = 0.0;

  if(x <= 0.0) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Domain error in bessel_K0_scaled\n");
#endif
  }
  else if(x <= 2.0)
    r = exp(x)*(-log(0.5*x)*xc_bessel_I0(x) - 0.25 + xc_cheb_eval(0.5*x*x - 1.0, bk0_data, 11));
  else if(x <= 8.0)
    r = (1.25 + xc_cheb_eval((16.0/x - 5.0)/3.0, ak0_data, 17))/sqrt(x);
  else
    r = (1.25 + xc_cheb_eval(16.0/x - 1.0, ak02_data, 14))/sqrt(x);

  return r;
}